

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_model.h
# Opt level: O0

void __thiscall
mp::FlatModel<mp::DefaultFlatModelParams>::SetObjectiveTo<mip_converter_test::MIPInstanceBackend>
          (FlatModel<mp::DefaultFlatModelParams> *this,MIPInstanceBackend *backend,int i,
          QuadraticObjective *obj)

{
  bool bVar1;
  size_t sVar2;
  QuadraticObjective *in_RCX;
  QuadraticObjective *in_RSI;
  undefined8 in_RDI;
  BasicFlatModelAPI *unaff_retaddr;
  LinearObjective *in_stack_000000e0;
  int in_stack_000000ec;
  MIPInstanceBackend *in_stack_000000f0;
  int iVar3;
  
  iVar3 = (int)((ulong)in_RDI >> 0x20);
  bVar1 = NLObjective::HasExpr(&in_RCX->super_NLObjective);
  if (bVar1) {
    BasicFlatModelAPI::SetNLObjective(unaff_retaddr,iVar3,&in_RSI->super_NLObjective);
  }
  else {
    QuadraticObjective::GetQPTerms(in_RCX);
    sVar2 = QuadTerms::size((QuadTerms *)0x3d61ae);
    if (sVar2 == 0) {
      mip_converter_test::MIPInstanceBackend::SetLinearObjective
                (in_stack_000000f0,in_stack_000000ec,in_stack_000000e0);
    }
    else {
      BasicFlatModelAPI::SetQuadraticObjective(unaff_retaddr,iVar3,in_RSI);
    }
  }
  return;
}

Assistant:

void SetObjectiveTo(
      Backend& backend, int i, const QuadraticObjective& obj) const {
    if (obj.HasExpr()) {
      assert(obj.GetQPTerms().empty());     // not mixing qudratics and expr
      backend.SetNLObjective(i, obj);
    } else if (obj.GetQPTerms().size())
      backend.SetQuadraticObjective(i, obj);
    else
      backend.SetLinearObjective(i, obj);
  }